

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void Mem_StepEntryRecycle(Mem_Step_t *p,char *pEntry,int nBytes)

{
  int nBytes_local;
  char *pEntry_local;
  Mem_Step_t *p_local;
  
  if ((nBytes != 0) && (nBytes <= p->nMapSize)) {
    Mem_FixedEntryRecycle(p->pMap[nBytes],pEntry);
  }
  return;
}

Assistant:

void Mem_StepEntryRecycle( Mem_Step_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
//        ABC_FREE( pEntry );
        return;
    }
    Mem_FixedEntryRecycle( p->pMap[nBytes], pEntry );
}